

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntAutoPtr<Diligent::BufferVkImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::BufferVkImpl>::operator=
          (RefCntAutoPtr<Diligent::BufferVkImpl> *this,BufferVkImpl *pObj)

{
  BufferVkImpl *this_00;
  
  this_00 = this->m_pObject;
  if (this_00 != pObj) {
    if (this_00 != (BufferVkImpl *)0x0) {
      DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>::
      Release((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
               *)this_00);
    }
    this->m_pObject = pObj;
    if (pObj != (BufferVkImpl *)0x0) {
      RefCountedObject<Diligent::IBufferVk>::AddRef((RefCountedObject<Diligent::IBufferVk> *)pObj);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }